

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void pushSelectionToManager(_GLFWwindow *window)

{
  int iVar1;
  undefined1 local_d0 [8];
  XEvent event;
  _GLFWwindow *window_local;
  
  event.pad[0x17] = (long)window;
  XConvertSelection(_glfw.x11.display,_glfw.x11.CLIPBOARD_MANAGER,_glfw.x11.SAVE_TARGETS,0,
                    (window->x11).handle);
  do {
    while( true ) {
      while( true ) {
        while (iVar1 = XCheckIfEvent(_glfw.x11.display,local_d0,isSelectionEvent,0), iVar1 == 0) {
          waitForEvent((double *)0x0);
        }
        if (local_d0._0_4_ != 0x1d) break;
        handleSelectionClear((XEvent *)local_d0);
      }
      if (local_d0._0_4_ != 0x1e) break;
      handleSelectionRequest((XEvent *)local_d0);
    }
  } while ((local_d0._0_4_ != 0x1f) || (event.xkey.root != _glfw.x11.SAVE_TARGETS));
  return;
}

Assistant:

static void pushSelectionToManager(_GLFWwindow* window)
{
    XConvertSelection(_glfw.x11.display,
                      _glfw.x11.CLIPBOARD_MANAGER,
                      _glfw.x11.SAVE_TARGETS,
                      None,
                      window->x11.handle,
                      CurrentTime);

    for (;;)
    {
        XEvent event;

        while (XCheckIfEvent(_glfw.x11.display, &event, isSelectionEvent, NULL))
        {
            switch (event.type)
            {
                case SelectionRequest:
                    handleSelectionRequest(&event);
                    break;

                case SelectionClear:
                    handleSelectionClear(&event);
                    break;

                case SelectionNotify:
                {
                    if (event.xselection.target == _glfw.x11.SAVE_TARGETS)
                    {
                        // This means one of two things; either the selection was
                        // not owned, which means there is no clipboard manager, or
                        // the transfer to the clipboard manager has completed
                        // In either case, it means we are done here
                        return;
                    }

                    break;
                }
            }
        }

        waitForEvent(NULL);
    }
}